

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupDfsCiMap(Gia_Man_t *p,int *pCi2Lit,Vec_Int_t *vLits)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  long lVar13;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      lVar13 = (long)pVVar10->pArray[lVar12];
      if ((lVar13 < 0) || (p->nObjs <= pVVar10->pArray[lVar12])) goto LAB_001e7f33;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_001e7f52:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_001e7f52;
      pGVar4[lVar13].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      uVar1 = pCi2Lit[lVar12];
      if (uVar1 != 0xffffffff) {
        if ((int)uVar1 < 0) goto LAB_001e7f90;
        if (p->nObjs <= (int)(uVar1 >> 1)) goto LAB_001e7f33;
        uVar7 = p->pObjs[uVar1 >> 1].Value;
        if ((int)uVar7 < 0) goto LAB_001e7f71;
        pGVar4[lVar13].Value = uVar7 ^ uVar1 & 1;
      }
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCis;
    } while (lVar12 < pVVar10->nSize);
  }
  Gia_ManHashAlloc(p_00);
  if (vLits == (Vec_Int_t *)0x0) {
    pVVar10 = p->vCos;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        iVar2 = pVVar10->pArray[lVar12];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001e7f33;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar2;
        Gia_ManDupDfs2_rec(p_00,p,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff));
        if ((int)pGVar4[-(*(ulong *)pGVar4 & 0x1fffffff)].Value < 0) goto LAB_001e7f71;
        Gia_ManAppendCo(p_00,(uint)(*(ulong *)pGVar4 >> 0x1d) & 1 ^
                             pGVar4[-(*(ulong *)pGVar4 & 0x1fffffff)].Value);
        lVar12 = lVar12 + 1;
        pVVar10 = p->vCos;
      } while (lVar12 < pVVar10->nSize);
    }
  }
  else if (0 < vLits->nSize) {
    lVar12 = 0;
    do {
      uVar1 = vLits->pArray[lVar12];
      if ((int)uVar1 < 0) {
LAB_001e7f90:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (p->nObjs <= (int)(uVar1 >> 1)) {
LAB_001e7f33:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar7 = Gia_ManDupDfs2_rec(p_00,p,p->pObjs + (uVar1 >> 1));
      if ((int)uVar7 < 0) {
LAB_001e7f71:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar7 ^ uVar1 & 1);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vLits->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsCiMap( Gia_Man_t * p, int * pCi2Lit, Vec_Int_t * vLits )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi(pNew);
        if ( ~pCi2Lit[i] )
            pObj->Value = Abc_LitNotCond( Gia_ManObj(p, Abc_Lit2Var(pCi2Lit[i]))->Value, Abc_LitIsCompl(pCi2Lit[i]) );
    }
    Gia_ManHashAlloc( pNew );
    if ( vLits )
    {
        int iLit, iLitRes;
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            iLitRes = Gia_ManDupDfs2_rec( pNew, p, Gia_ManObj(p, Abc_Lit2Var(iLit)) );
            Gia_ManAppendCo( pNew, Abc_LitNotCond( iLitRes, Abc_LitIsCompl(iLit)) );
        }
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
        {
            Gia_ManDupDfs2_rec( pNew, p, Gia_ObjFanin0(pObj) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}